

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O2

void capnp::_::
     checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<bool> expected)

{
  uint uVar1;
  Fault f;
  ListElementCount local_54;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ulong local_28;
  
  local_28 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == local_28;
  _kjCondition.left = local_28;
  if (_kjCondition.result) {
    for (uVar1 = 0; uVar1 < local_28; uVar1 = uVar1 + 1) {
      checkElement<bool>(expected._M_array[uVar1],
                         (reader.builder.ptr[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0);
    }
    return;
  }
  local_54 = reader.builder.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_28,&local_54);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}